

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.h
# Opt level: O1

void __thiscall
dap::BasicTypeInfo<dap::ExceptionOptions>::construct
          (BasicTypeInfo<dap::ExceptionOptions> *this,void *ptr)

{
  *(undefined8 *)ptr = 0;
  *(undefined8 *)((long)ptr + 8) = 0;
  *(undefined8 *)((long)ptr + 0x10) = 0;
  *(undefined8 *)((long)ptr + 0x18) = 0;
  *(undefined8 *)((long)ptr + 0x30) = 0;
  *(undefined8 *)((long)ptr + 0x38) = 0;
  *(undefined8 *)((long)ptr + 0x20) = 0;
  *(undefined8 *)((long)ptr + 0x28) = 0;
  *(long *)ptr = (long)ptr + 0x10;
  *(undefined4 *)((long)ptr + 0x10) = 0x6576656e;
  *(undefined2 *)((long)ptr + 0x14) = 0x72;
  *(undefined8 *)((long)ptr + 8) = 5;
  *(undefined8 *)((long)ptr + 0x29) = 0;
  *(undefined8 *)((long)ptr + 0x31) = 0;
  return;
}

Assistant:

inline void construct(void* ptr) const override { new (ptr) T(); }